

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

void __thiscall wasm::Module::removeExports(Module *this,function<bool_(wasm::Export_*)> *pred)

{
  function<bool_(wasm::Export_*)> local_38;
  function<bool_(wasm::Export_*)> *local_18;
  function<bool_(wasm::Export_*)> *pred_local;
  Module *this_local;
  
  local_18 = pred;
  pred_local = (function<bool_(wasm::Export_*)> *)this;
  std::function<bool_(wasm::Export_*)>::function(&local_38,pred);
  removeModuleElements<std::vector<std::unique_ptr<wasm::Export,std::default_delete<wasm::Export>>,std::allocator<std::unique_ptr<wasm::Export,std::default_delete<wasm::Export>>>>,std::unordered_map<wasm::Name,wasm::Export*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Export*>>>,wasm::Export>
            (&this->exports,&this->exportsMap,&local_38);
  std::function<bool_(wasm::Export_*)>::~function(&local_38);
  return;
}

Assistant:

void Module::removeExports(std::function<bool(Export*)> pred) {
  removeModuleElements(exports, exportsMap, pred);
}